

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<char>::import_whitespace
          (CATNMachine<char> *this,CharClass<char> *cc,int origin,int tag)

{
  int dest;
  CharClass<char> local_38;
  
  local_38._vptr_CharClass = (_func_int **)&PTR__CharClass_00196f28;
  local_38.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dest = add_node(this,&local_38,origin,tag);
  CharClass<char>::~CharClass(&local_38);
  CATNNode<char>::add_transition
            ((this->m_nodes).
             super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start + dest,cc,dest,0);
  return dest;
}

Assistant:

int import_whitespace(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        origin = add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes[origin].add_transition(cc, origin);
        return origin;
    }